

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O2

void GC::CheckBasePointer(char *basePtr)

{
  uint uVar1;
  ExternTypeInfo *elementType;
  ulong uVar2;
  
  PrintMarker(*(markerType *)(basePtr + -8));
  elementType = FastVector<ExternTypeInfo,_false,_false>::operator[]
                          ((FastVector<ExternTypeInfo,_false,_false> *)(NULLC::commonLinker + 0x200)
                           ,*(uint *)(basePtr + -7));
  if ((basePtr[-8] & 0x10U) != 0) {
    uVar1._0_1_ = elementType->defaultAlign;
    uVar1._1_1_ = elementType->typeFlags;
    uVar1._2_2_ = elementType->pointerCount;
    uVar2 = 4;
    if (4 < (byte)(undefined1)uVar1) {
      uVar2 = (ulong)uVar1;
    }
    CheckArrayElements(basePtr + (uVar2 & 0xff),*(uint *)(basePtr + ((uVar2 & 0xff) - 4)),
                       elementType);
    return;
  }
  if (elementType->subCat != CAT_NONE) {
    CheckVariable(basePtr,elementType);
    return;
  }
  return;
}

Assistant:

void CheckBasePointer(char* basePtr)
	{
		markerType	*marker = (markerType*)(basePtr - sizeof(markerType));
		PrintMarker(*marker);

		unsigned typeId = unsigned(*marker >> 8);
		const ExternTypeInfo &type = NULLC::commonLinker->exTypes[typeId];

		if(*marker & OBJECT_ARRAY)
		{
			unsigned arrayPadding = type.defaultAlign > 4 ? type.defaultAlign : 4;

			char *elements = basePtr + arrayPadding;

			unsigned size;
			memcpy(&size, elements - sizeof(unsigned), sizeof(unsigned));

			CheckArrayElements(elements, size, type);
		}
		else
		{
			// And if type is not simple, check memory to which pointer points to
			if(type.subCat != ExternTypeInfo::CAT_NONE)
				CheckVariable(basePtr, type);
		}
	}